

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::a64::ARMRAPass::emitMove
          (ARMRAPass *this,uint32_t workId,uint32_t dstPhysId,uint32_t srcPhysId)

{
  bool bVar1;
  Error EVar2;
  RAWorkReg *this_00;
  char *comment;
  BaseReg src;
  BaseReg dst;
  RAWorkReg *wReg;
  char *in_stack_000001b8;
  TypeId in_stack_000001c7;
  Operand_ *in_stack_000001c8;
  Operand_ *in_stack_000001d0;
  EmitHelper *in_stack_000001d8;
  Signature *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  this_00 = BaseRAPass::workRegById
                      ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  RAWorkReg::signature(this_00);
  BaseReg::BaseReg((BaseReg *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,0);
  RAWorkReg::signature(this_00);
  BaseReg::BaseReg((BaseReg *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,0);
  bVar1 = BaseRAPass::hasDiagnosticOption
                    ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (DiagnosticOptions)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  if (bVar1) {
    BaseRAPass::workRegById
              ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    RAWorkReg::name((RAWorkReg *)0x173771);
    String::assignFormat<char_const*>
              ((String *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,(char **)0x17378c);
    String::data((String *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  RAWorkReg::typeId((RAWorkReg *)0x1737bb);
  EVar2 = EmitHelper::emitRegMove
                    (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c7,
                     in_stack_000001b8);
  return EVar2;
}

Assistant:

Error ARMRAPass::emitMove(uint32_t workId, uint32_t dstPhysId, uint32_t srcPhysId) noexcept {
  RAWorkReg* wReg = workRegById(workId);
  BaseReg dst(wReg->signature(), dstPhysId);
  BaseReg src(wReg->signature(), srcPhysId);

  const char* comment = nullptr;

#ifndef ASMJIT_NO_LOGGING
  if (hasDiagnosticOption(DiagnosticOptions::kRAAnnotate)) {
    _tmpString.assignFormat("<MOVE> %s", workRegById(workId)->name());
    comment = _tmpString.data();
  }
#endif

  return _emitHelper.emitRegMove(dst, src, wReg->typeId(), comment);
}